

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::cmRST(cmRST *this,ostream *os,string *docroot)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_d1 [17];
  RegularExpression *local_c0;
  RegularExpression *local_b8;
  RegularExpression *local_b0;
  RegularExpression *local_a8;
  RegularExpression *local_a0;
  RegularExpression *local_98;
  RegularExpression *local_90;
  RegularExpression *local_88;
  RegularExpression *local_80;
  RegularExpression *local_78;
  RegularExpression *local_70;
  RegularExpression *local_68;
  RegularExpression *local_60;
  string *local_58;
  key_type local_50;
  
  this->OS = os;
  std::__cxx11::string::string((string *)&this->DocRoot,(string *)docroot);
  this->IncludeDepth = 0;
  this->OutputLinePending = false;
  this->LastLineEndedInColonColon = false;
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  local_58 = &this->DocRoot;
  cmsys::RegularExpression::RegularExpression
            (&this->CMakeDirective,
             "^.. (cmake:)?(command|envvar|genex|variable)::[ \t]+([^ \t\n]+)$");
  local_60 = &this->CMakeDirective;
  cmsys::RegularExpression::RegularExpression
            (&this->CMakeModuleDirective,"^.. cmake-module::[ \t]+([^ \t\n]+)$");
  local_68 = &this->CMakeModuleDirective;
  cmsys::RegularExpression::RegularExpression
            (&this->ParsedLiteralDirective,"^.. parsed-literal::[ \t]*(.*)$");
  local_70 = &this->ParsedLiteralDirective;
  cmsys::RegularExpression::RegularExpression
            (&this->CodeBlockDirective,"^.. code-block::[ \t]*(.*)$");
  local_80 = &this->ReplaceDirective;
  local_78 = &this->CodeBlockDirective;
  cmsys::RegularExpression::RegularExpression(local_80,"^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$");
  local_88 = &this->IncludeDirective;
  cmsys::RegularExpression::RegularExpression(local_88,"^.. include::[ \t]+([^ \t\n]+)$");
  local_90 = &this->TocTreeDirective;
  cmsys::RegularExpression::RegularExpression(local_90,"^.. toctree::[ \t]*(.*)$");
  local_98 = &this->ProductionListDirective;
  cmsys::RegularExpression::RegularExpression(local_98,"^.. productionlist::[ \t]*(.*)$");
  local_a0 = &this->NoteDirective;
  cmsys::RegularExpression::RegularExpression(local_a0,"^.. note::[ \t]*(.*)$");
  local_a8 = &this->VersionDirective;
  cmsys::RegularExpression::RegularExpression(local_a8,"^.. version(added|changed)::[ \t]*(.*)$");
  local_b0 = &this->ModuleRST;
  cmsys::RegularExpression::RegularExpression(local_b0,"^#\\[(=*)\\[\\.rst:$");
  local_b8 = &this->CMakeRole;
  cmsys::RegularExpression::RegularExpression
            (local_b8,
             "(:cmake)?:(command|cpack_gen|generator|genex|variable|envvar|module|policy|prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|prop_test|prop_tgt|manual):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`"
            );
  local_c0 = &this->InlineLink;
  cmsys::RegularExpression::RegularExpression(local_c0,"`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_");
  cmsys::RegularExpression::RegularExpression(&this->InlineLiteral,"``([^`]*)``");
  cmsys::RegularExpression::RegularExpression
            (&this->Substitution,
             "(^|[^A-Za-z0-9_])((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))([^A-Za-z0-9_]|$)"
            );
  cmsys::RegularExpression::RegularExpression(&this->TocTreeLink,"^.*[ \t]+<([^>]+)>$");
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DocDir)._M_dataplus._M_p = (pointer)&(this->DocDir).field_2;
  (this->DocDir)._M_string_length = 0;
  (this->DocDir).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Replace)._M_t._M_impl.super__Rb_tree_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Replaced)._M_t._M_impl.super__Rb_tree_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ReplaceName)._M_dataplus._M_p = (pointer)&(this->ReplaceName).field_2;
  (this->ReplaceName)._M_string_length = 0;
  (this->ReplaceName).field_2._M_local_buf[0] = '\0';
  cmVersion::GetCMakeVersion();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|release|",local_d1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->Replace,&local_50);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

cmRST::cmRST(std::ostream& os, std::string docroot)
  : OS(os)
  , DocRoot(std::move(docroot))
  , CMakeDirective("^.. (cmake:)?("
                   "command|envvar|genex|variable"
                   ")::[ \t]+([^ \t\n]+)$")
  , CMakeModuleDirective("^.. cmake-module::[ \t]+([^ \t\n]+)$")
  , ParsedLiteralDirective("^.. parsed-literal::[ \t]*(.*)$")
  , CodeBlockDirective("^.. code-block::[ \t]*(.*)$")
  , ReplaceDirective("^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$")
  , IncludeDirective("^.. include::[ \t]+([^ \t\n]+)$")
  , TocTreeDirective("^.. toctree::[ \t]*(.*)$")
  , ProductionListDirective("^.. productionlist::[ \t]*(.*)$")
  , NoteDirective("^.. note::[ \t]*(.*)$")
  , VersionDirective("^.. version(added|changed)::[ \t]*(.*)$")
  , ModuleRST(R"(^#\[(=*)\[\.rst:$)")
  , CMakeRole("(:cmake)?:("
              "command|cpack_gen|generator|genex|"
              "variable|envvar|module|policy|"
              "prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|"
              "prop_test|prop_tgt|"
              "manual"
              "):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`")
  , InlineLink("`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`_")
  , InlineLiteral("``([^`]*)``")
  , Substitution("(^|[^A-Za-z0-9_])"
                 "((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))"
                 "([^A-Za-z0-9_]|$)")
  , TocTreeLink("^.*[ \t]+<([^>]+)>$")
{
  this->Replace["|release|"] = cmVersion::GetCMakeVersion();
}